

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_buffer.cc
# Opt level: O0

void __thiscall webrtc::AudioBuffer::CopyLowPassToReference(AudioBuffer *this)

{
  short *__dest;
  int16_t *__src;
  pointer pCVar1;
  size_t sVar2;
  ChannelBuffer<short> *this_00;
  short **ppsVar3;
  int16_t **ppiVar4;
  ulong local_28;
  size_t i;
  AudioBuffer *this_local;
  
  this->reference_copied_ = true;
  pCVar1 = std::
           unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
           ::get(&this->low_pass_reference_channels_);
  if (pCVar1 != (pointer)0x0) {
    pCVar1 = std::
             unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
             ::operator->(&this->low_pass_reference_channels_);
    sVar2 = ChannelBuffer<short>::num_channels(pCVar1);
    if (sVar2 == this->num_channels_) goto LAB_0022b8f7;
  }
  this_00 = (ChannelBuffer<short> *)operator_new(0x38);
  ChannelBuffer<short>::ChannelBuffer(this_00,this->num_split_frames_,this->num_proc_channels_,1);
  std::unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  ::reset(&this->low_pass_reference_channels_,this_00);
LAB_0022b8f7:
  for (local_28 = 0; local_28 < this->num_proc_channels_; local_28 = local_28 + 1) {
    pCVar1 = std::
             unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
             ::operator->(&this->low_pass_reference_channels_);
    ppsVar3 = ChannelBuffer<short>::channels(pCVar1);
    __dest = ppsVar3[local_28];
    ppiVar4 = split_bands_const(this,local_28);
    __src = *ppiVar4;
    pCVar1 = std::
             unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
             ::operator->(&this->low_pass_reference_channels_);
    sVar2 = ChannelBuffer<short>::num_frames_per_band(pCVar1);
    memcpy(__dest,__src,sVar2 << 1);
  }
  return;
}

Assistant:

void AudioBuffer::CopyLowPassToReference() {
  reference_copied_ = true;
  if (!low_pass_reference_channels_.get() ||
      low_pass_reference_channels_->num_channels() != num_channels_) {
    low_pass_reference_channels_.reset(
        new ChannelBuffer<int16_t>(num_split_frames_,
                                   num_proc_channels_));
  }
  for (size_t i = 0; i < num_proc_channels_; i++) {
    memcpy(low_pass_reference_channels_->channels()[i],
           split_bands_const(i)[kBand0To8kHz],
           low_pass_reference_channels_->num_frames_per_band() *
               sizeof(split_bands_const(i)[kBand0To8kHz][0]));
  }
}